

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  ulong uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  uint uVar11;
  size_t *psVar13;
  ulong uVar14;
  uint uVar15;
  ulong in_R11;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auStack_48 [16];
  PrimRef *local_38;
  long lVar12;
  undefined1 extraout_var [56];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  local_38 = prims;
  auVar23._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar23._8_56_ = extraout_var;
  auVar25._8_8_ = 0;
  auVar25._0_4_ = time_range->lower;
  auVar25._4_4_ = time_range->upper;
  auVar20 = auVar23._0_16_;
  uVar10 = vcmpps_avx512vl(auVar20,auVar25,1);
  auVar19 = vblendps_avx(auVar25,auVar20,2);
  auVar20 = vinsertps_avx(auVar20,auVar25,0x50);
  bVar7 = (bool)((byte)uVar10 & 1);
  auVar16._0_4_ = (float)((uint)bVar7 * auVar19._0_4_ | (uint)!bVar7 * auVar20._0_4_);
  bVar7 = (bool)((byte)(uVar10 >> 1) & 1);
  auVar16._4_4_ = (uint)bVar7 * auVar19._4_4_ | (uint)!bVar7 * auVar20._4_4_;
  bVar7 = (bool)((byte)(uVar10 >> 2) & 1);
  auVar16._8_4_ = (uint)bVar7 * auVar19._8_4_ | (uint)!bVar7 * auVar20._8_4_;
  bVar7 = (bool)((byte)(uVar10 >> 3) & 1);
  auVar16._12_4_ = (uint)bVar7 * auVar19._12_4_ | (uint)!bVar7 * auVar20._12_4_;
  auVar19 = vmovshdup_avx(auVar16);
  fVar24 = auVar19._0_4_;
  if (auVar16._0_4_ <= fVar24) {
    uVar10 = r->_begin;
    uVar4 = r->_end;
    if (uVar10 < uVar4) {
      aVar21.m128[2] = -INFINITY;
      aVar21._0_8_ = 0xff800000ff800000;
      aVar21.m128[3] = -INFINITY;
      aVar22.m128[2] = INFINITY;
      aVar22._0_8_ = 0x7f8000007f800000;
      aVar22.m128[3] = INFINITY;
      auVar19._8_4_ = 0xddccb9a2;
      auVar19._0_8_ = 0xddccb9a2ddccb9a2;
      auVar19._12_4_ = 0xddccb9a2;
      auVar20._8_4_ = 0x5dccb9a2;
      auVar20._0_8_ = 0x5dccb9a25dccb9a2;
      auVar20._12_4_ = 0x5dccb9a2;
      do {
        BVar2 = (this->super_LineSegments).super_Geometry.time_range;
        auVar28._8_8_ = 0;
        auVar28._0_4_ = BVar2.lower;
        auVar28._4_4_ = BVar2.upper;
        auVar25 = vmovshdup_avx(auVar28);
        auVar17 = vsubss_avx512f(auVar25,auVar28);
        fVar27 = BVar2.lower;
        auVar18 = vdivss_avx512f(ZEXT416((uint)(fVar24 - fVar27)),auVar17);
        lVar12 = *(long *)&(this->super_LineSegments).super_Geometry.field_0x58;
        uVar3 = *(uint *)(lVar12 + *(long *)&(this->super_LineSegments).field_0x68 * uVar10);
        uVar14 = (ulong)(uVar3 + 1);
        pBVar5 = (this->super_LineSegments).vertices.items;
        if (uVar14 < (pBVar5->super_RawBufferView).num) {
          fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
          auVar18 = ZEXT416((uint)(fVar1 * auVar18._0_4_ * 0.99999976));
          auVar18 = vroundss_avx(auVar18,auVar18,10);
          auVar26 = ZEXT416((uint)fVar1);
          auVar18 = vminss_avx(auVar18,auVar26);
          uVar11 = (uint)auVar18._0_4_;
          lVar12 = CONCAT44((int)((ulong)lVar12 >> 0x20),uVar11);
          auVar17 = vdivss_avx512f(ZEXT416((uint)(auVar16._0_4_ - fVar27)),auVar17);
          auVar17 = vmulss_avx512f(auVar17,SUB6416(ZEXT464(0x3f800002),0));
          auVar17 = vmulss_avx512f(auVar26,auVar17);
          auVar17 = vrndscaless_avx512f(auVar17,auVar17);
          *(uint *)(lVar12 + -0x5f) = *(uint *)(lVar12 + -0x5f) | (uint)auStack_48;
          *(byte *)(uVar14 - 0x40) = *(byte *)(uVar14 - 0x40) | (byte)in_R11;
          uVar15 = vcvttss2si_avx512f(auVar17);
          if (uVar11 < uVar15) {
LAB_01f0ef06:
            auVar19 = vsubss_avx512f(auVar25,auVar28);
            auVar20 = vdivss_avx512f(ZEXT416((uint)(auVar16._0_4_ - fVar27)),auVar19);
            vdivss_avx512f(ZEXT416((uint)(fVar24 - fVar27)),auVar19);
            auVar19 = vmulss_avx512f(auVar26,auVar20);
            vrndscaless_avx512f(auVar19,auVar19);
            *(uint *)(lVar12 + -0x5f) = *(uint *)(lVar12 + -0x5f) | (uint)auStack_48;
            halt_baddata();
          }
          in_R11 = (ulong)(int)uVar15;
          psVar13 = &pBVar5[in_R11].super_RawBufferView.stride;
          while( true ) {
            pcVar6 = ((RawBufferView *)(psVar13 + -2))->ptr_ofs;
            auVar17 = *(undefined1 (*) [16])(pcVar6 + *psVar13 * (ulong)uVar3);
            uVar8 = vcmpps_avx512vl(auVar17,auVar19,6);
            uVar9 = vcmpps_avx512vl(auVar17,auVar20,1);
            if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) break;
            auVar18 = *(undefined1 (*) [16])(pcVar6 + *psVar13 * uVar14);
            uVar8 = vcmpps_avx512vl(auVar18,auVar19,6);
            uVar9 = vcmpps_avx512vl(auVar18,auVar20,1);
            uVar15 = (uint)uVar8 & (uint)uVar9;
            lVar12 = CONCAT44((int)((ulong)pcVar6 >> 0x20),uVar15);
            if ((char)uVar15 != '\x0f') break;
            auVar17 = vshufps_avx512vl(auVar17,auVar17,0xff);
            auVar18 = vshufps_avx512vl(auVar18,auVar18,0xff);
            auVar17 = vminss_avx512f(auVar17,auVar18);
            vucomiss_avx512f(auVar17);
            in_R11 = in_R11 + 1;
            psVar13 = psVar13 + 7;
            if ((ulong)(long)(int)uVar11 < in_R11) goto LAB_01f0ef06;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar4);
    }
    else {
      aVar21 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vbroadcastss_avx512vl(ZEXT416(0xff800000));
      aVar22 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar22;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar21;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar22;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar21;
    __return_storage_ptr__->end = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }